

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::ModeRm
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this,
          idx_t frame)

{
  DataChunk *result;
  int iVar1;
  ColumnDataScanState *state;
  size_t sVar2;
  interval_t *piVar3;
  long lVar4;
  long lVar5;
  reference pvVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  key_type *__k;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (uVar7 = state->current_row_index, frame < uVar7)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (interval_t *)pvVar6->data;
    pvVar6 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar6);
    this->validity = &pvVar6->validity;
    uVar7 = this->scan->current_row_index;
  }
  __k = this->data + (uint)((int)frame - (int)uVar7);
  pmVar8 = ::std::__detail::
           _Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::interval_t,_std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::interval_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::interval_t>,_std::hash<duckdb::interval_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar2 = pmVar8->count;
  this->nonzero = this->nonzero - (ulong)(sVar2 == 1);
  pmVar8->count = sVar2 - 1;
  if (this->count == sVar2) {
    piVar3 = this->mode;
    iVar1 = __k->days;
    lVar4 = __k->micros;
    lVar5 = piVar3->micros;
    iVar10 = piVar3->days;
    if ((piVar3->days != iVar1 || piVar3->months != __k->months) || (iVar10 = iVar1, lVar4 != lVar5)
       ) {
      lVar9 = (long)iVar1 + lVar4 / 86400000000;
      lVar11 = (long)iVar10 + lVar5 / 86400000000;
      if ((long)__k->months + lVar9 / 0x1e != (long)piVar3->months + lVar11 / 0x1e) {
        return;
      }
      if (lVar9 % 0x1e != lVar11 % 0x1e) {
        return;
      }
      if (lVar4 % 86400000000 != lVar5 % 86400000000) {
        return;
      }
    }
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}